

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

string * __thiscall ArgsManager::GetHelpMessage_abi_cxx11_(ArgsManager *this)

{
  bool bVar1;
  bool bVar2;
  reference ppVar3;
  reference ppVar4;
  string *in_RDI;
  long in_FS_OFFSET;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>
  *arg;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>
  *__range2;
  pair<const_OptionsCategory,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>_>
  *arg_map;
  map<OptionsCategory,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>,_std::less<OptionsCategory>,_std::allocator<std::pair<const_OptionsCategory,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>_>_>_>
  *__range1;
  bool show_debug;
  string *usage;
  const_iterator __end2;
  const_iterator __begin2;
  const_iterator __end1;
  const_iterator __begin1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock19;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa68;
  ArgsManager *in_stack_fffffffffffffa70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa80;
  undefined8 in_stack_fffffffffffffa88;
  char *in_stack_fffffffffffffa90;
  string *in_stack_fffffffffffffa98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaa0;
  allocator<char> *in_stack_fffffffffffffaa8;
  allocator<char> *in_stack_fffffffffffffab0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffab8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffac0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffac8;
  undefined1 local_47f;
  undefined1 local_47e [2];
  allocator<char> local_47c;
  undefined1 local_47b;
  undefined1 local_47a [2];
  allocator<char> local_478;
  undefined1 local_477;
  undefined1 local_476;
  undefined1 local_475 [2];
  allocator<char> local_473;
  allocator<char> local_472;
  allocator<char> local_471;
  _Base_ptr local_470;
  undefined8 local_468;
  allocator<char> local_459 [1105];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffab8,(char *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  bVar1 = GetBoolArg(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
                     SUB81((ulong)in_stack_fffffffffffffa78 >> 0x38,0));
  std::__cxx11::string::~string(in_stack_fffffffffffffa68);
  std::allocator<char>::~allocator(local_459);
  std::__cxx11::string::string(in_stack_fffffffffffffa80);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffa68);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffaa8,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffaa0,
             (char *)in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
             (int)((ulong)in_stack_fffffffffffffa88 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffa88 >> 0x18,0));
  local_468 = std::
              map<OptionsCategory,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>,_std::less<OptionsCategory>,_std::allocator<std::pair<const_OptionsCategory,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>_>_>_>
              ::begin((map<OptionsCategory,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>,_std::less<OptionsCategory>,_std::allocator<std::pair<const_OptionsCategory,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>_>_>_>
                       *)in_stack_fffffffffffffa70);
  local_470 = (_Base_ptr)
              std::
              map<OptionsCategory,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>,_std::less<OptionsCategory>,_std::allocator<std::pair<const_OptionsCategory,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>_>_>_>
              ::end((map<OptionsCategory,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>,_std::less<OptionsCategory>,_std::allocator<std::pair<const_OptionsCategory,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>_>_>_>
                     *)in_stack_fffffffffffffa70);
  while (bVar2 = std::operator==((_Self *)in_stack_fffffffffffffa78,
                                 (_Self *)in_stack_fffffffffffffa70), ((bVar2 ^ 0xffU) & 1) != 0) {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_OptionsCategory,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>_>_>
             ::operator*((_Rb_tree_const_iterator<std::pair<const_OptionsCategory,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>_>_>
                          *)in_stack_fffffffffffffa68);
    switch(ppVar3->first) {
    case OPTIONS:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffab8,(char *)in_stack_fffffffffffffab0,
                 in_stack_fffffffffffffaa8);
      HelpMessageGroup(in_stack_fffffffffffffa98);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_stack_fffffffffffffa78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa70);
      std::__cxx11::string::~string(in_stack_fffffffffffffa68);
      std::__cxx11::string::~string(in_stack_fffffffffffffa68);
      std::allocator<char>::~allocator(&local_471);
      break;
    case CONNECTION:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffab8,(char *)in_stack_fffffffffffffab0,
                 in_stack_fffffffffffffaa8);
      HelpMessageGroup(in_stack_fffffffffffffa98);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_stack_fffffffffffffa78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa70);
      std::__cxx11::string::~string(in_stack_fffffffffffffa68);
      std::__cxx11::string::~string(in_stack_fffffffffffffa68);
      std::allocator<char>::~allocator(&local_472);
      break;
    case WALLET:
      in_stack_fffffffffffffaa8 = (allocator<char> *)(local_47a + 1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffab8,(char *)in_stack_fffffffffffffab0,
                 in_stack_fffffffffffffaa8);
      HelpMessageGroup(in_stack_fffffffffffffa98);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_stack_fffffffffffffa78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa70);
      std::__cxx11::string::~string(in_stack_fffffffffffffa68);
      std::__cxx11::string::~string(in_stack_fffffffffffffa68);
      std::allocator<char>::~allocator((allocator<char> *)(local_47a + 1));
      break;
    case WALLET_DEBUG_TEST:
      if (bVar1) {
        in_stack_fffffffffffffaa0 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_47a;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffab8,(char *)in_stack_fffffffffffffab0,
                   in_stack_fffffffffffffaa8);
        HelpMessageGroup(in_stack_fffffffffffffa98);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (in_stack_fffffffffffffa78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffa70);
        std::__cxx11::string::~string(in_stack_fffffffffffffa68);
        std::__cxx11::string::~string(in_stack_fffffffffffffa68);
        std::allocator<char>::~allocator((allocator<char> *)local_47a);
      }
      break;
    case ZMQ:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffab8,(char *)in_stack_fffffffffffffab0,
                 in_stack_fffffffffffffaa8);
      HelpMessageGroup(in_stack_fffffffffffffa98);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_stack_fffffffffffffa78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa70);
      std::__cxx11::string::~string(in_stack_fffffffffffffa68);
      std::__cxx11::string::~string(in_stack_fffffffffffffa68);
      std::allocator<char>::~allocator(&local_473);
      break;
    case DEBUG_TEST:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffab8,(char *)in_stack_fffffffffffffab0,
                 in_stack_fffffffffffffaa8);
      HelpMessageGroup(in_stack_fffffffffffffa98);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_stack_fffffffffffffa78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa70);
      std::__cxx11::string::~string(in_stack_fffffffffffffa68);
      std::__cxx11::string::~string(in_stack_fffffffffffffa68);
      std::allocator<char>::~allocator((allocator<char> *)(local_475 + 1));
      break;
    case CHAINPARAMS:
      in_stack_fffffffffffffa98 = (string *)&local_47b;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffab8,(char *)in_stack_fffffffffffffab0,
                 in_stack_fffffffffffffaa8);
      HelpMessageGroup(in_stack_fffffffffffffa98);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_stack_fffffffffffffa78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa70);
      std::__cxx11::string::~string(in_stack_fffffffffffffa68);
      std::__cxx11::string::~string(in_stack_fffffffffffffa68);
      std::allocator<char>::~allocator((allocator<char> *)&local_47b);
      break;
    case NODE_RELAY:
      in_stack_fffffffffffffac8 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_475;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffab8,(char *)in_stack_fffffffffffffab0,
                 in_stack_fffffffffffffaa8);
      HelpMessageGroup(in_stack_fffffffffffffa98);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_stack_fffffffffffffa78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa70);
      std::__cxx11::string::~string(in_stack_fffffffffffffa68);
      std::__cxx11::string::~string(in_stack_fffffffffffffa68);
      std::allocator<char>::~allocator((allocator<char> *)local_475);
      break;
    case BLOCK_CREATION:
      in_stack_fffffffffffffac0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_476;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffab8,(char *)in_stack_fffffffffffffab0,
                 in_stack_fffffffffffffaa8);
      HelpMessageGroup(in_stack_fffffffffffffa98);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_stack_fffffffffffffa78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa70);
      std::__cxx11::string::~string(in_stack_fffffffffffffa68);
      std::__cxx11::string::~string(in_stack_fffffffffffffa68);
      std::allocator<char>::~allocator((allocator<char> *)&local_476);
      break;
    case RPC:
      in_stack_fffffffffffffab8 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_477;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffab8,(char *)in_stack_fffffffffffffab0,
                 in_stack_fffffffffffffaa8);
      HelpMessageGroup(in_stack_fffffffffffffa98);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_stack_fffffffffffffa78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa70);
      std::__cxx11::string::~string(in_stack_fffffffffffffa68);
      std::__cxx11::string::~string(in_stack_fffffffffffffa68);
      std::allocator<char>::~allocator((allocator<char> *)&local_477);
      break;
    case GUI:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffab8,(char *)in_stack_fffffffffffffab0,
                 in_stack_fffffffffffffaa8);
      HelpMessageGroup(in_stack_fffffffffffffa98);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_stack_fffffffffffffa78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa70);
      std::__cxx11::string::~string(in_stack_fffffffffffffa68);
      std::__cxx11::string::~string(in_stack_fffffffffffffa68);
      std::allocator<char>::~allocator(&local_47c);
      break;
    case COMMANDS:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffab8,(char *)in_stack_fffffffffffffab0,
                 in_stack_fffffffffffffaa8);
      HelpMessageGroup(in_stack_fffffffffffffa98);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_stack_fffffffffffffa78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa70);
      std::__cxx11::string::~string(in_stack_fffffffffffffa68);
      std::__cxx11::string::~string(in_stack_fffffffffffffa68);
      std::allocator<char>::~allocator((allocator<char> *)(local_47e + 1));
      break;
    case REGISTER_COMMANDS:
      in_stack_fffffffffffffa80 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_47e;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffab8,(char *)in_stack_fffffffffffffab0,
                 in_stack_fffffffffffffaa8);
      HelpMessageGroup(in_stack_fffffffffffffa98);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_stack_fffffffffffffa78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa70);
      std::__cxx11::string::~string(in_stack_fffffffffffffa68);
      std::__cxx11::string::~string(in_stack_fffffffffffffa68);
      std::allocator<char>::~allocator((allocator<char> *)local_47e);
      break;
    case CLI_COMMANDS:
      in_stack_fffffffffffffa78 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_47f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffab8,(char *)in_stack_fffffffffffffab0,
                 in_stack_fffffffffffffaa8);
      HelpMessageGroup(in_stack_fffffffffffffa98);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_stack_fffffffffffffa78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa70);
      std::__cxx11::string::~string(in_stack_fffffffffffffa68);
      std::__cxx11::string::~string(in_stack_fffffffffffffa68);
      std::allocator<char>::~allocator((allocator<char> *)&local_47f);
      break;
    case IPC:
      in_stack_fffffffffffffab0 = &local_478;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffab8,(char *)in_stack_fffffffffffffab0,
                 in_stack_fffffffffffffaa8);
      HelpMessageGroup(in_stack_fffffffffffffa98);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_stack_fffffffffffffa78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa70);
      std::__cxx11::string::~string(in_stack_fffffffffffffa68);
      std::__cxx11::string::~string(in_stack_fffffffffffffa68);
      std::allocator<char>::~allocator(&local_478);
    }
    if (ppVar3->first == HIDDEN) break;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>
    ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>
             *)in_stack_fffffffffffffa70);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>
    ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>
           *)in_stack_fffffffffffffa70);
    while (bVar2 = std::operator==((_Self *)in_stack_fffffffffffffa78,
                                   (_Self *)in_stack_fffffffffffffa70), ((bVar2 ^ 0xffU) & 1) != 0)
    {
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>
               ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>
                            *)in_stack_fffffffffffffa68);
      if ((bVar1) || (((ppVar4->second).m_flags & 0x100) == 0)) {
        std::__cxx11::string::string(in_stack_fffffffffffffa80);
        bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty(in_stack_fffffffffffffa68);
        if (bVar2) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (in_stack_fffffffffffffa78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffa70);
        }
        else {
          std::operator+(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
          std::__cxx11::string::~string(in_stack_fffffffffffffa68);
        }
        HelpMessageOpt(in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (in_stack_fffffffffffffa78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffa70);
        std::__cxx11::string::~string(in_stack_fffffffffffffa68);
        std::__cxx11::string::~string(in_stack_fffffffffffffa68);
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>
                    *)in_stack_fffffffffffffa68);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_OptionsCategory,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_OptionsCategory,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>_>_>
                  *)in_stack_fffffffffffffa68);
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffa68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string ArgsManager::GetHelpMessage() const
{
    const bool show_debug = GetBoolArg("-help-debug", false);

    std::string usage;
    LOCK(cs_args);
    for (const auto& arg_map : m_available_args) {
        switch(arg_map.first) {
            case OptionsCategory::OPTIONS:
                usage += HelpMessageGroup("Options:");
                break;
            case OptionsCategory::CONNECTION:
                usage += HelpMessageGroup("Connection options:");
                break;
            case OptionsCategory::ZMQ:
                usage += HelpMessageGroup("ZeroMQ notification options:");
                break;
            case OptionsCategory::DEBUG_TEST:
                usage += HelpMessageGroup("Debugging/Testing options:");
                break;
            case OptionsCategory::NODE_RELAY:
                usage += HelpMessageGroup("Node relay options:");
                break;
            case OptionsCategory::BLOCK_CREATION:
                usage += HelpMessageGroup("Block creation options:");
                break;
            case OptionsCategory::RPC:
                usage += HelpMessageGroup("RPC server options:");
                break;
            case OptionsCategory::IPC:
                usage += HelpMessageGroup("IPC interprocess connection options:");
                break;
            case OptionsCategory::WALLET:
                usage += HelpMessageGroup("Wallet options:");
                break;
            case OptionsCategory::WALLET_DEBUG_TEST:
                if (show_debug) usage += HelpMessageGroup("Wallet debugging/testing options:");
                break;
            case OptionsCategory::CHAINPARAMS:
                usage += HelpMessageGroup("Chain selection options:");
                break;
            case OptionsCategory::GUI:
                usage += HelpMessageGroup("UI Options:");
                break;
            case OptionsCategory::COMMANDS:
                usage += HelpMessageGroup("Commands:");
                break;
            case OptionsCategory::REGISTER_COMMANDS:
                usage += HelpMessageGroup("Register Commands:");
                break;
            case OptionsCategory::CLI_COMMANDS:
                usage += HelpMessageGroup("CLI Commands:");
                break;
            default:
                break;
        }

        // When we get to the hidden options, stop
        if (arg_map.first == OptionsCategory::HIDDEN) break;

        for (const auto& arg : arg_map.second) {
            if (show_debug || !(arg.second.m_flags & ArgsManager::DEBUG_ONLY)) {
                std::string name;
                if (arg.second.m_help_param.empty()) {
                    name = arg.first;
                } else {
                    name = arg.first + arg.second.m_help_param;
                }
                usage += HelpMessageOpt(name, arg.second.m_help_text);
            }
        }
    }
    return usage;
}